

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O3

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::
make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
          (quadratic_cost_type<double> *this,int n,
          linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *rng)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double *pdVar5;
  undefined8 extraout_RAX;
  int *piVar6;
  ulong uVar7;
  long lVar8;
  pointer ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  pointer ppVar12;
  _Adaptor<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_double>
  __aurng;
  double dVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> r;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  q;
  allocator_type local_79;
  double local_78;
  int local_6c;
  vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_> local_68;
  quadratic_cost_type<double> *local_50;
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  local_48;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  std::vector<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>::vector
            (&local_68,(long)n,(allocator_type *)&local_48);
  local_50 = this;
  std::
  vector<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
  ::vector(&local_48,
           (long)(this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl[n],&local_79);
  ppVar11 = local_68.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ppVar10 = local_68.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (n != 0) {
    uVar7 = 0;
    pdVar5 = (local_50->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    piVar6 = &(local_68.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    do {
      ((pair<double,_int> *)(piVar6 + -2))->first = pdVar5[uVar7];
      *piVar6 = (int)uVar7;
      uVar7 = uVar7 + 1;
      piVar6 = piVar6 + 4;
    } while ((uint)n != uVar7);
  }
  ppVar9 = local_68.
           super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_6c = n;
  if (local_68.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (local_68.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_68.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_68.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_68.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
              (ppVar10,ppVar11);
    ppVar9 = local_68.
             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ppVar10 = local_68.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    for (ppVar11 = local_68.
                   super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; ppVar11 != ppVar9;
        ppVar11 = ppVar11 + 1) {
      dVar1 = ppVar10->first;
      dVar13 = ppVar11->first;
      if (((dVar13 != dVar1) || (ppVar12 = ppVar10, NAN(dVar13) || NAN(dVar1))) &&
         (ppVar12 = ppVar11, 0x10 < (long)ppVar11 - (long)ppVar10)) {
        local_78 = dVar13 - dVar1;
        do {
          auVar14._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar14._8_56_ = extraout_var;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_78;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = dVar1;
          auVar2 = vfmadd213sd_fma(auVar14._0_16_,auVar17,auVar2);
          ppVar10->first = auVar2._0_8_;
          ppVar10 = ppVar10 + 1;
        } while (ppVar10 != ppVar11);
      }
      ppVar10 = ppVar12;
    }
  }
  if (0x10 < (long)ppVar9 - (long)ppVar10) {
    if ((long)ppVar10 -
        (long)local_68.
              super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start == 0) {
      dVar1 = ppVar10->first;
      dVar13 = dVar1 + 1.0;
      if ((dVar1 == dVar13) && (!NAN(dVar1) && !NAN(dVar13))) goto LAB_001868b0;
      if (ppVar10 != ppVar9) {
        local_78 = dVar13 - dVar1;
        do {
          auVar16._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar16._8_56_ = extraout_var_01;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_78;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = dVar1;
          auVar2 = vfmadd213sd_fma(auVar16._0_16_,auVar19,auVar4);
          ppVar10->first = auVar2._0_8_;
          ppVar10 = ppVar10 + 1;
        } while (ppVar10 != ppVar9);
      }
    }
    else {
      dVar13 = linearize<long,double>
                         (0,(local_68.
                             super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->first,
                          (long)ppVar10 -
                          (long)local_68.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4,ppVar10->first,
                          (long)local_68.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_68.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4);
      dVar1 = ppVar10->first;
      if ((dVar1 == dVar13) && (!NAN(dVar1) && !NAN(dVar13))) {
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
LAB_001868b0:
        make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>();
        if (local_68.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_68.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_68.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_68.
                                super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(extraout_RAX);
      }
      if (ppVar10 != ppVar9) {
        local_78 = dVar13 - dVar1;
        do {
          auVar15._0_8_ =
               std::
               generate_canonical<double,53ul,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
                         (rng);
          auVar15._8_56_ = extraout_var_00;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = local_78;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = dVar1;
          auVar2 = vfmadd213sd_fma(auVar15._0_16_,auVar18,auVar3);
          ppVar10->first = auVar2._0_8_;
          ppVar10 = ppVar10 + 1;
        } while (ppVar10 != ppVar9);
      }
    }
  }
  ppVar10 = local_68.
            super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (local_68.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_68.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (local_68.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               local_68.
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
               (int)LZCOUNT((long)local_68.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_68.
                                  super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::pair<double,int>*,std::vector<std::pair<double,int>,std::allocator<std::pair<double,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::quadratic_cost_type<double>::make_random_norm<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>(int,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_2_>>
              (ppVar10,local_68.
                       super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  if (local_6c != 0) {
    lVar8 = 0;
    pdVar5 = (local_50->linear_elements)._M_t.
             super___uniq_ptr_impl<double,_std::default_delete<double[]>_>._M_t.
             super__Tuple_impl<0UL,_double_*,_std::default_delete<double[]>_>.
             super__Head_base<0UL,_double_*,_false>._M_head_impl;
    do {
      *(undefined8 *)((long)pdVar5 + lVar8) =
           *(undefined8 *)
            ((long)&(local_68.
                     super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first + lVar8 * 2);
      lVar8 = lVar8 + 8;
    } while ((ulong)(uint)n << 3 != lVar8);
  }
  make_loo_norm(local_50,local_6c);
  if (local_48.
      super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.
                          super__Vector_base<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>,_std::allocator<std::pair<baryonyx::itm::quadratic_cost_type<double>::quad,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void make_random_norm(int n, Random& rng)
    {
        std::vector<std::pair<Float, int>> r(n);
        std::vector<std::pair<quad, int>> q(indices[n]);

        for (int i = 0; i != n; ++i)
            r[i] = { linear_elements[i], i };

        std::sort(r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
            return lhs.first < rhs.first;
        });

        {
            auto begin = r.begin();
            auto end = r.end();
            auto next = r.begin()++;
            for (; next != end; ++next) {
                if (next->first != begin->first) {
                    if (std::distance(begin, next) > 1)
                        random_epsilon_unique(
                          begin, next, rng, begin->first, next->first);

                    begin = next;
                }
            }

            if (std::distance(begin, end) > 1) {
                if (begin == r.begin()) {
                    random_epsilon_unique(
                      begin, end, rng, begin->first, begin->first + 1);
                } else {
                    auto value = linearize(std::ptrdiff_t(0),
                                           r.front().first,
                                           std::distance(r.begin(), begin),
                                           begin->first,
                                           std::distance(r.begin(), r.end()));

                    random_epsilon_unique(
                      begin, end, rng, begin->first, value);
                }
            }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            std::sort(
              r.begin(), r.end(), [](const auto& lhs, const auto& rhs) {
                  return lhs.second < rhs.second;
              });
        }

        {
            // auto begin = q.begin();
            // auto end = q.end();
            // auto next = q.begin()++;
            // for (; next != end; ++next) {
            //     if (next->first != begin->first) {
            //         if (std::distance(begin, next) > 1)
            //             random_epsilon_unique(
            //               begin, next, rng, begin->first,
            //               next->first);

            //         begin = next;
            //     }
            // }

            // if (std::distance(begin, end) > 1) {
            //     if (begin == q.begin()) {
            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, begin->first +
            //           1);
            //     } else {
            //         auto value = linearize(std::ptrdiff_t(0),
            //                                q.front().first,
            //                                std::distance(q.begin(),
            //                                begin), begin->first,
            //                                std::distance(q.begin(),
            //                                q.end()));

            //         random_epsilon_unique(
            //           begin, end, rng, begin->first, value);
            //     }
            // }

            // Reorder the vector according to the variable index, so,
            // it restores the initial order.

            // std::sort(
            //   q.begin(), q.end(), [](const auto& lhs, const auto&
            //   rhs) {
            //       return lhs.second < rhs.second;
            //   });
        }

        for (int i = 0; i != n; ++i)
            linear_elements[i] = r[i].first;
        // for (int i = 0; i != n; ++i) {
        //     quadratic_elements[i].factor = r[i].first.factor;

        // Finally we compute the l+oo norm.
        make_loo_norm(n);
    }